

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausRecordClause2(Clu_Man_t *p,Aig_Cut_t *pCut,int iMint,int Cost)

{
  Vec_Int_t *pVVar1;
  lit Entry;
  int Entry_00;
  int local_24;
  int i;
  int Cost_local;
  int iMint_local;
  Aig_Cut_t *pCut_local;
  Clu_Man_t *p_local;
  
  for (local_24 = 0; local_24 < pCut->nFanins; local_24 = local_24 + 1) {
    pVVar1 = p->vLits;
    Entry = toLitCond(p->pCnf->pVarNums[*(int *)((long)&pCut[1].pNext + (long)local_24 * 4)],
                      iMint & 1 << ((byte)local_24 & 0x1f));
    Vec_IntPush(pVVar1,Entry);
  }
  pVVar1 = p->vClauses;
  Entry_00 = Vec_IntSize(p->vLits);
  Vec_IntPush(pVVar1,Entry_00);
  Vec_IntPush(p->vCosts,Cost);
  return;
}

Assistant:

void Fra_ClausRecordClause2( Clu_Man_t * p, Aig_Cut_t * pCut, int iMint, int Cost )
{
    int i;
    for ( i = 0; i < (int)pCut->nFanins; i++ )
        Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pCut->pFanins[i]], (iMint&(1<<i)) ) );
    Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
    Vec_IntPush( p->vCosts, Cost );
}